

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 float128_to_floatx80_m68k(float128 a,float_status *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  floatx80 fVar4;
  int32_t aExp;
  uint local_3c;
  ulong local_38;
  ulong local_30;
  
  uVar3 = a.high;
  local_38 = a.low;
  local_30 = uVar3 & 0xffffffffffff;
  local_3c = a.high._6_2_ & 0x7fff;
  uVar1 = a.high._4_4_ >> 0x1f;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_38 != 0) {
      normalizeFloat128Subnormal(local_30,local_38,(int32_t *)&local_3c,&local_30,&local_38);
      uVar3 = local_30;
      goto LAB_006caa84;
    }
    uVar1 = uVar1 << 0xf;
  }
  else {
    if (local_3c != 0x7fff) {
      uVar3 = local_30 + 0x1000000000000;
LAB_006caa84:
      fVar4 = roundAndPackFloatx80_m68k
                        ('P',a.high._7_1_ >> 7,local_3c,uVar3 << 0xf | local_38 >> 0x31,
                         local_38 << 0xf,status);
      return fVar4;
    }
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_38 != 0) {
      if (((uVar3 & 0x7fff800000000000) == 0x7fff000000000000) &&
         (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
          local_38 != 0)) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      uVar2 = uVar3 << 0x10 | local_38 >> 0x30;
      uVar3 = uVar2 >> 1 | 0x8000000000000000;
      uVar1 = uVar1 << 0xf | 0x7fff;
      if (uVar2 < 2 || status->default_nan_mode != '\0') {
        uVar3 = 0xffffffffffffffff;
        uVar1 = 0x7fff;
      }
      goto LAB_006caaba;
    }
    uVar1 = uVar1 << 0xf | 0x7fff;
  }
  uVar3 = 0;
LAB_006caaba:
  fVar4._8_4_ = uVar1;
  fVar4.low = uVar3;
  fVar4._12_4_ = 0;
  return fVar4;
}

Assistant:

floatx80 float128_to_floatx80(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloatx80(float128ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    else {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shortShift128Left( aSig0, aSig1, 15, &aSig0, &aSig1 );
    return roundAndPackFloatx80(80, aSign, aExp, aSig0, aSig1, status);

}